

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExpression::TagExpression(TagExpression *this)

{
  TagExpression *this_local;
  
  std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::vector(&this->m_tagSets);
  return;
}

Assistant:

bool matches( std::set<std::string> const& tags ) const {
            std::vector<TagSet>::const_iterator it = m_tagSets.begin();
            std::vector<TagSet>::const_iterator itEnd = m_tagSets.end();
            for(; it != itEnd; ++it )
                if( it->matches( tags ) )
                    return true;
            return false;
        }